

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcStdin.c
# Opt level: O2

void Wlc_ComputeSum(char *pRes,char *pAdd,int nBits,int Radix)

{
  uint __line;
  ulong uVar1;
  ulong uVar2;
  char *__assertion;
  bool bVar3;
  char cVar4;
  char cVar5;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)nBits;
  if (nBits < 1) {
    uVar2 = uVar1;
  }
  bVar3 = false;
  do {
    if (uVar2 == uVar1) {
      if (bVar3 == false) {
        return;
      }
      __assertion = "Carry == 0";
      __line = 0x3c;
LAB_001c9bcb:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wlc/wlcStdin.c"
                    ,__line,"void Wlc_ComputeSum(char *, char *, int, int)");
    }
    cVar4 = bVar3 + pRes[uVar1] + pAdd[uVar1];
    cVar5 = (char)Radix;
    if (cVar4 < Radix) {
      cVar5 = '\0';
    }
    cVar5 = cVar4 - cVar5;
    if ((cVar5 < '\0') || (Radix <= cVar5)) {
      __assertion = "Sum >= 0 && Sum < Radix";
      __line = 0x39;
      goto LAB_001c9bcb;
    }
    pRes[uVar1] = cVar5;
    bVar3 = Radix <= cVar4;
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Converts a bit-string into a number in a given radix.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wlc_ComputeSum( char * pRes, char * pAdd, int nBits, int Radix )
{
    char Carry = 0;  int i; 
    for ( i = 0; i < nBits; i++ )
    {
        char Sum = pRes[i] + pAdd[i] + Carry;
        if ( Sum >= Radix )
        {
            Sum -= Radix;
            Carry = 1;
        }
        else 
            Carry = 0;
        assert( Sum >= 0 && Sum < Radix );
        pRes[i] = Sum;
    }
    assert( Carry == 0 );
}